

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_bool spvc_compiler_variable_is_depth_or_compare(spvc_compiler compiler,spvc_variable_id id)

{
  spvc_context_s *this;
  CompilerGLSL *this_00;
  VariableID local_58 [5];
  allocator local_41;
  string local_40;
  spvc_variable_id local_1c;
  spvc_compiler psStack_18;
  spvc_variable_id id_local;
  spvc_compiler compiler_local;
  
  local_1c = id;
  psStack_18 = compiler;
  if (compiler->backend == SPVC_BACKEND_NONE) {
    this = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,
               "Cross-compilation related option used on NONE backend which only supports reflection."
               ,&local_41);
    spvc_context_s::report_error(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    compiler_local._7_1_ = 0xfc;
  }
  else {
    this_00 = (CompilerGLSL *)
              std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
              get(&compiler->compiler);
    spirv_cross::TypedID<(spirv_cross::Types)2>::TypedID(local_58,local_1c);
    compiler_local._7_1_ =
         spirv_cross::CompilerGLSL::variable_is_depth_or_compare(this_00,local_58[0]);
  }
  return compiler_local._7_1_;
}

Assistant:

spvc_bool spvc_compiler_variable_is_depth_or_compare(spvc_compiler compiler, spvc_variable_id id)
{
#if SPIRV_CROSS_C_API_GLSL
	if (compiler->backend == SPVC_BACKEND_NONE)
	{
		compiler->context->report_error("Cross-compilation related option used on NONE backend which only supports reflection.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	return static_cast<CompilerGLSL *>(compiler->compiler.get())->variable_is_depth_or_compare(id) ? SPVC_TRUE : SPVC_FALSE;
#else
	(void)id;
	compiler->context->report_error("Cross-compilation related option used on NONE backend which only supports reflection.");
	return SPVC_FALSE;
#endif
}